

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

uint32 __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::UnescapeToTempBuf
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr p,EncodedCharPtr last)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  char16 cVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  uint uVar7;
  byte *local_48;
  char16 local_3e;
  uint local_3c;
  uint uStack_38;
  char16 upper;
  codepoint_t codePoint;
  char16 lower;
  bool isMultiChar;
  
  (this->m_tempChBuf).m_ichCur = 0;
  uVar5 = 0;
  if (p < last) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      local_48 = p + 1;
      bVar1 = *p;
      cVar4 = (char16)bVar1;
      if ((char)bVar1 < '\0') {
        cVar4 = utf8::DecodeTail((ushort)bVar1,&local_48,last,
                                 &(this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions,
                                 (bool *)0x0);
      }
      uVar7 = (uint)(ushort)cVar4;
      uStack_38 = (uint)(ushort)cVar4;
      if (uStack_38 < 0x80) {
        if (uVar7 == 0x5c) {
          TryReadEscape(this,&local_48,last,&stack0xffffffffffffffc8);
        }
LAB_00f04358:
        local_3c = uStack_38;
      }
      else {
        codePoint._3_1_ = 1;
        if ((this->es6UnicodeMode != true) ||
           (bVar3 = Js::NumberUtilities::IsSurrogateLowerPart(uVar7), !bVar3)) goto LAB_00f04358;
        bVar3 = TryReadCodePointRest<false>
                          (this,uVar7,&local_48,last,&local_3c,(bool *)((long)&codePoint + 3));
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                             ,0x22c,"(gotCodePoint)","gotCodePoint");
          if (!bVar3) goto LAB_00f043fc;
          *puVar6 = 0;
        }
      }
      if (0x10ffff < local_3c) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0x22d,"(codePoint < 0x110000)","codePoint < 0x110000");
        if (!bVar3) {
LAB_00f043fc:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      uVar7 = local_3c;
      if (0xffff < local_3c) {
        Js::NumberUtilities::CodePointAsSurrogatePair
                  (local_3c,(char16 *)&stack0xffffffffffffffc8,&local_3e);
        TemporaryBuffer::AppendCh<true>(&this->m_tempChBuf,uStack_38 & 0xffff);
        uVar7 = (uint)(ushort)local_3e;
      }
      TemporaryBuffer::AppendCh<true>(&this->m_tempChBuf,uVar7);
      p = local_48;
    } while (local_48 < last);
    uVar5 = (this->m_tempChBuf).m_ichCur;
  }
  return uVar5;
}

Assistant:

uint32 Scanner<EncodingPolicy>::UnescapeToTempBuf(EncodedCharPtr p, EncodedCharPtr last)
{
    m_tempChBuf.Reset();
    while( p < last )
    {
        codepoint_t codePoint;
        bool hasEscape, isMultiChar;
        bool gotCodePoint = TryReadCodePoint<false>(p, last, &codePoint, &hasEscape, &isMultiChar);
        Assert(gotCodePoint);
        Assert(codePoint < 0x110000);
        if (codePoint < 0x10000)
        {
            m_tempChBuf.AppendCh((OLECHAR)codePoint);
        }
        else
        {
            char16 lower, upper;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &upper);
            m_tempChBuf.AppendCh(lower);
            m_tempChBuf.AppendCh(upper);
        }
    }
    return m_tempChBuf.m_ichCur;
}